

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void __thiscall RegexTree::or_link(RegexTree *this,RegexTree *rhs)

{
  tree_node *this_00;
  tree_node *_or;
  RegexTree *rhs_local;
  RegexTree *this_local;
  
  this_00 = (tree_node *)operator_new(0x18);
  tree_node::tree_node(this_00);
  this_00->c = '\n';
  this_00->right = this->root;
  this_00->left = rhs->root;
  rhs->root = (tree_node *)0x0;
  this->root = this_00;
  return;
}

Assistant:

void RegexTree::or_link(RegexTree &rhs) {
    tree_node *_or = new tree_node;
    _or->c = OR;
    _or->right = root;
    _or->left = rhs.root;
    rhs.root = nullptr;
    root = _or;
}